

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

int Abc_ObjReverseLevelNew(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  undefined4 local_24;
  int Level;
  int LevelCur;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  local_24 = 0;
  for (Level = 0; iVar1 = Abc_ObjFanoutNum(pObj), Level < iVar1; Level = Level + 1) {
    pObj_00 = Abc_ObjFanout(pObj,Level);
    iVar1 = Abc_ObjReverseLevel(pObj_00);
    fVar2 = Abc_MaxFloat((float)local_24,(float)iVar1);
    local_24 = (int)fVar2;
  }
  return local_24 + 1;
}

Assistant:

int Abc_ObjReverseLevelNew( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, LevelCur, Level = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        LevelCur = Abc_ObjReverseLevel( pFanout );
        Level = Abc_MaxFloat( Level, LevelCur );
    }
    return Level + 1;
}